

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O2

Vec3<embree::vfloat_impl<4>_> *
embree::sse2::patchEval<embree::vfloat_impl<4>>
          (SubdivPatch1Base *patch,vfloat_impl<4> *uu,vfloat_impl<4> *vv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  Vec3<embree::vfloat_impl<4>_> *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar53 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar75 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar85 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  uint uVar125;
  float fVar126;
  uint uVar127;
  float fVar128;
  uint uVar129;
  float fVar130;
  uint uVar131;
  float fVar132;
  
  switch(patch->type) {
  case '\x01':
    fVar62 = (uu->field_0).v[0];
    fVar95 = (uu->field_0).v[1];
    fVar96 = (uu->field_0).v[2];
    fVar97 = (uu->field_0).v[3];
    fVar92 = 1.0 - fVar62;
    fVar71 = 1.0 - fVar95;
    fVar81 = 1.0 - fVar96;
    fVar11 = 1.0 - fVar97;
    fVar98 = fVar92 * fVar92 * fVar92;
    fVar50 = fVar71 * fVar71 * fVar71;
    fVar86 = fVar81 * fVar81 * fVar81;
    fVar89 = fVar11 * fVar11 * fVar11;
    fVar8 = fVar62 * fVar62 * fVar62;
    fVar15 = fVar95 * fVar95 * fVar95;
    fVar18 = fVar96 * fVar96 * fVar96;
    fVar21 = fVar97 * fVar97 * fVar97;
    fVar14 = fVar92 * fVar62 * fVar92;
    fVar64 = fVar71 * fVar95 * fVar71;
    fVar73 = fVar81 * fVar96 * fVar81;
    fVar51 = fVar11 * fVar97 * fVar11;
    fVar62 = fVar62 * fVar92 * fVar62;
    fVar95 = fVar95 * fVar71 * fVar95;
    fVar96 = fVar96 * fVar81 * fVar96;
    fVar97 = fVar97 * fVar11 * fVar97;
    fVar9 = fVar98 * 0.16666667;
    fVar16 = fVar50 * 0.16666667;
    fVar19 = fVar86 * 0.16666667;
    fVar22 = fVar89 * 0.16666667;
    fVar40 = (fVar62 * 6.0 + fVar14 * 12.0 + fVar98 * 4.0 + fVar8) * 0.16666667;
    fVar42 = (fVar95 * 6.0 + fVar64 * 12.0 + fVar50 * 4.0 + fVar15) * 0.16666667;
    fVar44 = (fVar96 * 6.0 + fVar73 * 12.0 + fVar86 * 4.0 + fVar18) * 0.16666667;
    fVar46 = (fVar97 * 6.0 + fVar51 * 12.0 + fVar89 * 4.0 + fVar21) * 0.16666667;
    fVar25 = (fVar14 * 6.0 + fVar62 * 12.0 + fVar8 * 4.0 + fVar98) * 0.16666667;
    fVar29 = (fVar64 * 6.0 + fVar95 * 12.0 + fVar15 * 4.0 + fVar50) * 0.16666667;
    fVar33 = (fVar73 * 6.0 + fVar96 * 12.0 + fVar18 * 4.0 + fVar86) * 0.16666667;
    fVar37 = (fVar51 * 6.0 + fVar97 * 12.0 + fVar21 * 4.0 + fVar89) * 0.16666667;
    fVar8 = fVar8 * 0.16666667;
    fVar15 = fVar15 * 0.16666667;
    fVar18 = fVar18 * 0.16666667;
    fVar21 = fVar21 * 0.16666667;
    fVar62 = (vv->field_0).v[0];
    fVar95 = (vv->field_0).v[1];
    fVar96 = (vv->field_0).v[2];
    fVar97 = (vv->field_0).v[3];
    fVar98 = 1.0 - fVar62;
    fVar86 = 1.0 - fVar95;
    fVar92 = 1.0 - fVar96;
    fVar71 = 1.0 - fVar97;
    fVar81 = fVar98 * fVar98 * fVar98;
    fVar73 = fVar86 * fVar86 * fVar86;
    fVar11 = fVar92 * fVar92 * fVar92;
    fVar51 = fVar71 * fVar71 * fVar71;
    fVar63 = fVar62 * fVar62 * fVar62;
    fVar66 = fVar95 * fVar95 * fVar95;
    fVar68 = fVar96 * fVar96 * fVar96;
    fVar70 = fVar97 * fVar97 * fVar97;
    fVar50 = fVar98 * fVar62 * fVar98;
    fVar89 = fVar86 * fVar95 * fVar86;
    fVar14 = fVar92 * fVar96 * fVar92;
    fVar64 = fVar71 * fVar97 * fVar71;
    fVar62 = fVar62 * fVar98 * fVar62;
    fVar95 = fVar95 * fVar86 * fVar95;
    fVar96 = fVar96 * fVar92 * fVar96;
    fVar97 = fVar97 * fVar71 * fVar97;
    fVar48 = fVar81 * 0.16666667;
    fVar54 = fVar73 * 0.16666667;
    fVar57 = fVar11 * 0.16666667;
    fVar60 = fVar51 * 0.16666667;
    fVar72 = (fVar62 * 6.0 + fVar50 * 12.0 + fVar81 * 4.0 + fVar63) * 0.16666667;
    fVar76 = (fVar95 * 6.0 + fVar89 * 12.0 + fVar73 * 4.0 + fVar66) * 0.16666667;
    fVar78 = (fVar96 * 6.0 + fVar14 * 12.0 + fVar11 * 4.0 + fVar68) * 0.16666667;
    fVar80 = (fVar97 * 6.0 + fVar64 * 12.0 + fVar51 * 4.0 + fVar70) * 0.16666667;
    fVar24 = (fVar50 * 6.0 + fVar62 * 12.0 + fVar63 * 4.0 + fVar81) * 0.16666667;
    fVar28 = (fVar89 * 6.0 + fVar95 * 12.0 + fVar66 * 4.0 + fVar73) * 0.16666667;
    fVar32 = (fVar14 * 6.0 + fVar96 * 12.0 + fVar68 * 4.0 + fVar11) * 0.16666667;
    fVar36 = (fVar64 * 6.0 + fVar97 * 12.0 + fVar70 * 4.0 + fVar51) * 0.16666667;
    fVar63 = fVar63 * 0.16666667;
    fVar66 = fVar66 * 0.16666667;
    fVar68 = fVar68 * 0.16666667;
    fVar70 = fVar70 * 0.16666667;
    fVar95 = patch->patch_v[0][0].field_0.m128[0];
    fVar96 = patch->patch_v[1][0].field_0.m128[0];
    fVar97 = patch->patch_v[2][0].field_0.m128[0];
    fVar98 = patch->patch_v[3][0].field_0.m128[0];
    fVar50 = patch->patch_v[0][1].field_0.m128[0];
    fVar86 = patch->patch_v[1][1].field_0.m128[0];
    fVar89 = patch->patch_v[2][1].field_0.m128[0];
    fVar92 = patch->patch_v[3][1].field_0.m128[0];
    fVar14 = patch->patch_v[0][2].field_0.m128[0];
    fVar71 = patch->patch_v[1][2].field_0.m128[0];
    fVar64 = patch->patch_v[2][2].field_0.m128[0];
    fVar81 = patch->patch_v[3][2].field_0.m128[0];
    fVar73 = patch->patch_v[2][3].field_0.m128[0];
    fVar11 = patch->patch_v[3][3].field_0.m128[0];
    fVar62 = patch->patch_v[3][3].field_0.m128[1];
    fVar51 = patch->patch_v[1][3].field_0.m128[0];
    fVar52 = patch->patch_v[0][3].field_0.m128[0];
    fVar56 = patch->patch_v[0][0].field_0.m128[1];
    fVar59 = patch->patch_v[1][0].field_0.m128[1];
    fVar65 = patch->patch_v[2][0].field_0.m128[1];
    fVar67 = patch->patch_v[3][0].field_0.m128[1];
    fVar69 = patch->patch_v[0][1].field_0.m128[1];
    fVar74 = patch->patch_v[2][1].field_0.m128[1];
    fVar77 = patch->patch_v[3][1].field_0.m128[1];
    fVar79 = patch->patch_v[1][1].field_0.m128[1];
    fVar82 = patch->patch_v[2][2].field_0.m128[1];
    fVar1 = patch->patch_v[3][2].field_0.m128[1];
    fVar2 = patch->patch_v[1][2].field_0.m128[1];
    fVar3 = patch->patch_v[0][2].field_0.m128[1];
    fVar4 = patch->patch_v[2][3].field_0.m128[1];
    fVar5 = patch->patch_v[1][3].field_0.m128[1];
    fVar6 = patch->patch_v[0][3].field_0.m128[1];
    fVar99 = (fVar56 * fVar48 + fVar59 * fVar72 + fVar65 * fVar24 + fVar67 * fVar63) * fVar9 +
             (fVar69 * fVar48 + fVar79 * fVar72 + fVar74 * fVar24 + fVar77 * fVar63) * fVar40 +
             (fVar3 * fVar48 + fVar2 * fVar72 + fVar82 * fVar24 + fVar1 * fVar63) * fVar25 +
             (fVar6 * fVar48 + fVar5 * fVar72 + fVar4 * fVar24 + fVar62 * fVar63) * fVar8;
    fVar102 = (fVar56 * fVar54 + fVar59 * fVar76 + fVar65 * fVar28 + fVar67 * fVar66) * fVar16 +
              (fVar69 * fVar54 + fVar79 * fVar76 + fVar74 * fVar28 + fVar77 * fVar66) * fVar42 +
              (fVar3 * fVar54 + fVar2 * fVar76 + fVar82 * fVar28 + fVar1 * fVar66) * fVar29 +
              (fVar6 * fVar54 + fVar5 * fVar76 + fVar4 * fVar28 + fVar62 * fVar66) * fVar15;
    fVar105 = (fVar56 * fVar57 + fVar59 * fVar78 + fVar65 * fVar32 + fVar67 * fVar68) * fVar19 +
              (fVar69 * fVar57 + fVar79 * fVar78 + fVar74 * fVar32 + fVar77 * fVar68) * fVar44 +
              (fVar3 * fVar57 + fVar2 * fVar78 + fVar82 * fVar32 + fVar1 * fVar68) * fVar33 +
              (fVar6 * fVar57 + fVar5 * fVar78 + fVar4 * fVar32 + fVar62 * fVar68) * fVar18;
    fVar108 = (fVar56 * fVar60 + fVar59 * fVar80 + fVar65 * fVar36 + fVar67 * fVar70) * fVar22 +
              (fVar69 * fVar60 + fVar79 * fVar80 + fVar74 * fVar36 + fVar77 * fVar70) * fVar46 +
              (fVar3 * fVar60 + fVar2 * fVar80 + fVar82 * fVar36 + fVar1 * fVar70) * fVar37 +
              (fVar6 * fVar60 + fVar5 * fVar80 + fVar4 * fVar36 + fVar62 * fVar70) * fVar21;
    fVar56 = patch->patch_v[0][0].field_0.m128[2];
    fVar59 = patch->patch_v[1][0].field_0.m128[2];
    fVar65 = patch->patch_v[2][0].field_0.m128[2];
    fVar67 = patch->patch_v[3][0].field_0.m128[2];
    fVar69 = patch->patch_v[0][1].field_0.m128[2];
    fVar74 = patch->patch_v[2][1].field_0.m128[2];
    fVar77 = patch->patch_v[3][1].field_0.m128[2];
    fVar79 = patch->patch_v[1][1].field_0.m128[2];
    fVar82 = patch->patch_v[2][2].field_0.m128[2];
    fVar1 = patch->patch_v[3][2].field_0.m128[2];
    fVar2 = patch->patch_v[1][2].field_0.m128[2];
    fVar3 = patch->patch_v[0][2].field_0.m128[2];
    fVar62 = patch->patch_v[3][3].field_0.m128[2];
    fVar4 = patch->patch_v[2][3].field_0.m128[2];
    fVar5 = patch->patch_v[1][3].field_0.m128[2];
    fVar6 = patch->patch_v[0][3].field_0.m128[2];
    fVar49 = (fVar56 * fVar48 + fVar59 * fVar72 + fVar65 * fVar24 + fVar67 * fVar63) * fVar9 +
             (fVar69 * fVar48 + fVar79 * fVar72 + fVar74 * fVar24 + fVar77 * fVar63) * fVar40 +
             (fVar3 * fVar48 + fVar2 * fVar72 + fVar82 * fVar24 + fVar1 * fVar63) * fVar25 +
             (fVar6 * fVar48 + fVar5 * fVar72 + fVar4 * fVar24 + fVar62 * fVar63) * fVar8;
    fVar10 = (fVar56 * fVar54 + fVar59 * fVar76 + fVar65 * fVar28 + fVar67 * fVar66) * fVar16 +
             (fVar69 * fVar54 + fVar79 * fVar76 + fVar74 * fVar28 + fVar77 * fVar66) * fVar42 +
             (fVar3 * fVar54 + fVar2 * fVar76 + fVar82 * fVar28 + fVar1 * fVar66) * fVar29 +
             (fVar6 * fVar54 + fVar5 * fVar76 + fVar4 * fVar28 + fVar62 * fVar66) * fVar15;
    fVar55 = (fVar56 * fVar57 + fVar59 * fVar78 + fVar65 * fVar32 + fVar67 * fVar68) * fVar19 +
             (fVar69 * fVar57 + fVar79 * fVar78 + fVar74 * fVar32 + fVar77 * fVar68) * fVar44 +
             (fVar3 * fVar57 + fVar2 * fVar78 + fVar82 * fVar32 + fVar1 * fVar68) * fVar33 +
             (fVar6 * fVar57 + fVar5 * fVar78 + fVar4 * fVar32 + fVar62 * fVar68) * fVar18;
    fVar62 = (fVar56 * fVar60 + fVar59 * fVar80 + fVar65 * fVar36 + fVar67 * fVar70) * fVar22 +
             (fVar69 * fVar60 + fVar79 * fVar80 + fVar74 * fVar36 + fVar77 * fVar70) * fVar46 +
             (fVar3 * fVar60 + fVar2 * fVar80 + fVar82 * fVar36 + fVar1 * fVar70) * fVar37 +
             (fVar6 * fVar60 + fVar5 * fVar80 + fVar4 * fVar36 + fVar62 * fVar70) * fVar21;
    *(float *)&in_RDI->field_0 =
         (fVar95 * fVar48 + fVar96 * fVar72 + fVar97 * fVar24 + fVar98 * fVar63) * fVar9 +
         (fVar50 * fVar48 + fVar86 * fVar72 + fVar89 * fVar24 + fVar92 * fVar63) * fVar40 +
         (fVar14 * fVar48 + fVar71 * fVar72 + fVar64 * fVar24 + fVar81 * fVar63) * fVar25 +
         (fVar52 * fVar48 + fVar51 * fVar72 + fVar73 * fVar24 + fVar11 * fVar63) * fVar8;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar95 * fVar54 + fVar96 * fVar76 + fVar97 * fVar28 + fVar98 * fVar66) * fVar16 +
         (fVar50 * fVar54 + fVar86 * fVar76 + fVar89 * fVar28 + fVar92 * fVar66) * fVar42 +
         (fVar14 * fVar54 + fVar71 * fVar76 + fVar64 * fVar28 + fVar81 * fVar66) * fVar29 +
         (fVar52 * fVar54 + fVar51 * fVar76 + fVar73 * fVar28 + fVar11 * fVar66) * fVar15;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar95 * fVar57 + fVar96 * fVar78 + fVar97 * fVar32 + fVar98 * fVar68) * fVar19 +
         (fVar50 * fVar57 + fVar86 * fVar78 + fVar89 * fVar32 + fVar92 * fVar68) * fVar44 +
         (fVar14 * fVar57 + fVar71 * fVar78 + fVar64 * fVar32 + fVar81 * fVar68) * fVar33 +
         (fVar52 * fVar57 + fVar51 * fVar78 + fVar73 * fVar32 + fVar11 * fVar68) * fVar18;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar95 * fVar60 + fVar96 * fVar80 + fVar97 * fVar36 + fVar98 * fVar70) * fVar22 +
         (fVar50 * fVar60 + fVar86 * fVar80 + fVar89 * fVar36 + fVar92 * fVar70) * fVar46 +
         (fVar14 * fVar60 + fVar71 * fVar80 + fVar64 * fVar36 + fVar81 * fVar70) * fVar37 +
         (fVar52 * fVar60 + fVar51 * fVar80 + fVar73 * fVar36 + fVar11 * fVar70) * fVar21;
    break;
  case '\x02':
    fVar95 = (uu->field_0).v[0];
    fVar96 = (uu->field_0).v[1];
    fVar97 = (uu->field_0).v[2];
    fVar98 = (uu->field_0).v[3];
    fVar81 = 1.0 - fVar95;
    fVar73 = 1.0 - fVar96;
    fVar11 = 1.0 - fVar97;
    fVar51 = 1.0 - fVar98;
    fVar50 = (vv->field_0).v[0];
    fVar86 = (vv->field_0).v[1];
    fVar89 = (vv->field_0).v[2];
    fVar92 = (vv->field_0).v[3];
    fVar62 = 1.0 - fVar50;
    fVar14 = 1.0 - fVar86;
    fVar71 = 1.0 - fVar89;
    fVar64 = 1.0 - fVar92;
    fVar40 = fVar81 * fVar81 * fVar81;
    fVar42 = fVar73 * fVar73 * fVar73;
    fVar44 = fVar11 * fVar11 * fVar11;
    fVar46 = fVar51 * fVar51 * fVar51;
    fVar24 = fVar62 * fVar62 * fVar62;
    fVar28 = fVar14 * fVar14 * fVar14;
    fVar32 = fVar71 * fVar71 * fVar71;
    fVar36 = fVar64 * fVar64 * fVar64;
    fVar48 = fVar81 * fVar95 * fVar81 * 3.0;
    fVar54 = fVar73 * fVar96 * fVar73 * 3.0;
    fVar57 = fVar11 * fVar97 * fVar11 * 3.0;
    fVar60 = fVar51 * fVar98 * fVar51 * 3.0;
    fVar8 = fVar62 * fVar50 * fVar62 * 3.0;
    fVar15 = fVar14 * fVar86 * fVar14 * 3.0;
    fVar18 = fVar71 * fVar89 * fVar71 * 3.0;
    fVar21 = fVar64 * fVar92 * fVar64 * 3.0;
    fVar72 = fVar95 * fVar81 * fVar95 * 3.0;
    fVar76 = fVar96 * fVar73 * fVar96 * 3.0;
    fVar78 = fVar97 * fVar11 * fVar97 * 3.0;
    fVar80 = fVar98 * fVar51 * fVar98 * 3.0;
    fVar63 = fVar50 * fVar62 * fVar50 * 3.0;
    fVar66 = fVar86 * fVar14 * fVar86 * 3.0;
    fVar68 = fVar89 * fVar71 * fVar89 * 3.0;
    fVar70 = fVar92 * fVar64 * fVar92 * 3.0;
    fVar95 = fVar95 * fVar95 * fVar95;
    fVar96 = fVar96 * fVar96 * fVar96;
    fVar97 = fVar97 * fVar97 * fVar97;
    fVar98 = fVar98 * fVar98 * fVar98;
    fVar50 = fVar50 * fVar50 * fVar50;
    fVar86 = fVar86 * fVar86 * fVar86;
    fVar89 = fVar89 * fVar89 * fVar89;
    fVar92 = fVar92 * fVar92 * fVar92;
    fVar14 = patch->patch_v[0][0].field_0.m128[0];
    fVar71 = patch->patch_v[0][1].field_0.m128[0];
    fVar64 = patch->patch_v[0][2].field_0.m128[0];
    fVar81 = patch->patch_v[0][3].field_0.m128[0];
    fVar73 = patch->patch_v[1][0].field_0.m128[0];
    fVar11 = patch->patch_v[1][1].field_0.m128[0];
    fVar51 = patch->patch_v[1][2].field_0.m128[0];
    fVar52 = patch->patch_v[1][3].field_0.m128[0];
    fVar56 = patch->patch_v[2][0].field_0.m128[0];
    fVar59 = patch->patch_v[2][1].field_0.m128[0];
    fVar65 = patch->patch_v[2][2].field_0.m128[0];
    fVar67 = patch->patch_v[2][3].field_0.m128[0];
    fVar69 = patch->patch_v[3][2].field_0.m128[0];
    fVar74 = patch->patch_v[3][3].field_0.m128[0];
    fVar62 = patch->patch_v[3][3].field_0.m128[1];
    fVar77 = patch->patch_v[3][1].field_0.m128[0];
    fVar79 = patch->patch_v[3][0].field_0.m128[0];
    fVar82 = patch->patch_v[0][0].field_0.m128[1];
    fVar1 = patch->patch_v[0][1].field_0.m128[1];
    fVar2 = patch->patch_v[0][2].field_0.m128[1];
    fVar3 = patch->patch_v[0][3].field_0.m128[1];
    fVar4 = patch->patch_v[1][0].field_0.m128[1];
    fVar5 = patch->patch_v[1][2].field_0.m128[1];
    fVar6 = patch->patch_v[1][3].field_0.m128[1];
    fVar9 = patch->patch_v[1][1].field_0.m128[1];
    fVar16 = patch->patch_v[2][2].field_0.m128[1];
    fVar19 = patch->patch_v[2][3].field_0.m128[1];
    fVar22 = patch->patch_v[2][1].field_0.m128[1];
    fVar25 = patch->patch_v[2][0].field_0.m128[1];
    fVar29 = patch->patch_v[3][2].field_0.m128[1];
    fVar33 = patch->patch_v[3][1].field_0.m128[1];
    fVar37 = patch->patch_v[3][0].field_0.m128[1];
    fVar99 = (fVar82 * fVar40 + fVar1 * fVar48 + fVar2 * fVar72 + fVar3 * fVar95) * fVar24 +
             (fVar4 * fVar40 + fVar9 * fVar48 + fVar5 * fVar72 + fVar6 * fVar95) * fVar8 +
             (fVar25 * fVar40 + fVar22 * fVar48 + fVar16 * fVar72 + fVar19 * fVar95) * fVar63 +
             (fVar37 * fVar40 + fVar33 * fVar48 + fVar29 * fVar72 + fVar62 * fVar95) * fVar50;
    fVar102 = (fVar82 * fVar42 + fVar1 * fVar54 + fVar2 * fVar76 + fVar3 * fVar96) * fVar28 +
              (fVar4 * fVar42 + fVar9 * fVar54 + fVar5 * fVar76 + fVar6 * fVar96) * fVar15 +
              (fVar25 * fVar42 + fVar22 * fVar54 + fVar16 * fVar76 + fVar19 * fVar96) * fVar66 +
              (fVar37 * fVar42 + fVar33 * fVar54 + fVar29 * fVar76 + fVar62 * fVar96) * fVar86;
    fVar105 = (fVar82 * fVar44 + fVar1 * fVar57 + fVar2 * fVar78 + fVar3 * fVar97) * fVar32 +
              (fVar4 * fVar44 + fVar9 * fVar57 + fVar5 * fVar78 + fVar6 * fVar97) * fVar18 +
              (fVar25 * fVar44 + fVar22 * fVar57 + fVar16 * fVar78 + fVar19 * fVar97) * fVar68 +
              (fVar37 * fVar44 + fVar33 * fVar57 + fVar29 * fVar78 + fVar62 * fVar97) * fVar89;
    fVar108 = (fVar82 * fVar46 + fVar1 * fVar60 + fVar2 * fVar80 + fVar3 * fVar98) * fVar36 +
              (fVar4 * fVar46 + fVar9 * fVar60 + fVar5 * fVar80 + fVar6 * fVar98) * fVar21 +
              (fVar25 * fVar46 + fVar22 * fVar60 + fVar16 * fVar80 + fVar19 * fVar98) * fVar70 +
              (fVar37 * fVar46 + fVar33 * fVar60 + fVar29 * fVar80 + fVar62 * fVar98) * fVar92;
    fVar82 = patch->patch_v[0][0].field_0.m128[2];
    fVar1 = patch->patch_v[0][1].field_0.m128[2];
    fVar2 = patch->patch_v[0][2].field_0.m128[2];
    fVar3 = patch->patch_v[0][3].field_0.m128[2];
    fVar4 = patch->patch_v[1][0].field_0.m128[2];
    fVar5 = patch->patch_v[1][2].field_0.m128[2];
    fVar6 = patch->patch_v[1][3].field_0.m128[2];
    fVar9 = patch->patch_v[1][1].field_0.m128[2];
    fVar16 = patch->patch_v[2][2].field_0.m128[2];
    fVar19 = patch->patch_v[2][3].field_0.m128[2];
    fVar22 = patch->patch_v[2][1].field_0.m128[2];
    fVar25 = patch->patch_v[2][0].field_0.m128[2];
    fVar62 = patch->patch_v[3][3].field_0.m128[2];
    fVar29 = patch->patch_v[3][2].field_0.m128[2];
    fVar33 = patch->patch_v[3][1].field_0.m128[2];
    fVar37 = patch->patch_v[3][0].field_0.m128[2];
    fVar49 = (fVar82 * fVar40 + fVar1 * fVar48 + fVar2 * fVar72 + fVar3 * fVar95) * fVar24 +
             (fVar4 * fVar40 + fVar9 * fVar48 + fVar5 * fVar72 + fVar6 * fVar95) * fVar8 +
             (fVar25 * fVar40 + fVar22 * fVar48 + fVar16 * fVar72 + fVar19 * fVar95) * fVar63 +
             (fVar37 * fVar40 + fVar33 * fVar48 + fVar29 * fVar72 + fVar62 * fVar95) * fVar50;
    fVar10 = (fVar82 * fVar42 + fVar1 * fVar54 + fVar2 * fVar76 + fVar3 * fVar96) * fVar28 +
             (fVar4 * fVar42 + fVar9 * fVar54 + fVar5 * fVar76 + fVar6 * fVar96) * fVar15 +
             (fVar25 * fVar42 + fVar22 * fVar54 + fVar16 * fVar76 + fVar19 * fVar96) * fVar66 +
             (fVar37 * fVar42 + fVar33 * fVar54 + fVar29 * fVar76 + fVar62 * fVar96) * fVar86;
    fVar55 = (fVar82 * fVar44 + fVar1 * fVar57 + fVar2 * fVar78 + fVar3 * fVar97) * fVar32 +
             (fVar4 * fVar44 + fVar9 * fVar57 + fVar5 * fVar78 + fVar6 * fVar97) * fVar18 +
             (fVar25 * fVar44 + fVar22 * fVar57 + fVar16 * fVar78 + fVar19 * fVar97) * fVar68 +
             (fVar37 * fVar44 + fVar33 * fVar57 + fVar29 * fVar78 + fVar62 * fVar97) * fVar89;
    fVar62 = (fVar82 * fVar46 + fVar1 * fVar60 + fVar2 * fVar80 + fVar3 * fVar98) * fVar36 +
             (fVar4 * fVar46 + fVar9 * fVar60 + fVar5 * fVar80 + fVar6 * fVar98) * fVar21 +
             (fVar25 * fVar46 + fVar22 * fVar60 + fVar16 * fVar80 + fVar19 * fVar98) * fVar70 +
             (fVar37 * fVar46 + fVar33 * fVar60 + fVar29 * fVar80 + fVar62 * fVar98) * fVar92;
    *(float *)&in_RDI->field_0 =
         (fVar14 * fVar40 + fVar71 * fVar48 + fVar64 * fVar72 + fVar81 * fVar95) * fVar24 +
         (fVar73 * fVar40 + fVar11 * fVar48 + fVar51 * fVar72 + fVar52 * fVar95) * fVar8 +
         (fVar56 * fVar40 + fVar59 * fVar48 + fVar65 * fVar72 + fVar67 * fVar95) * fVar63 +
         (fVar79 * fVar40 + fVar77 * fVar48 + fVar69 * fVar72 + fVar74 * fVar95) * fVar50;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar14 * fVar42 + fVar71 * fVar54 + fVar64 * fVar76 + fVar81 * fVar96) * fVar28 +
         (fVar73 * fVar42 + fVar11 * fVar54 + fVar51 * fVar76 + fVar52 * fVar96) * fVar15 +
         (fVar56 * fVar42 + fVar59 * fVar54 + fVar65 * fVar76 + fVar67 * fVar96) * fVar66 +
         (fVar79 * fVar42 + fVar77 * fVar54 + fVar69 * fVar76 + fVar74 * fVar96) * fVar86;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar14 * fVar44 + fVar71 * fVar57 + fVar64 * fVar78 + fVar81 * fVar97) * fVar32 +
         (fVar73 * fVar44 + fVar11 * fVar57 + fVar51 * fVar78 + fVar52 * fVar97) * fVar18 +
         (fVar56 * fVar44 + fVar59 * fVar57 + fVar65 * fVar78 + fVar67 * fVar97) * fVar68 +
         (fVar79 * fVar44 + fVar77 * fVar57 + fVar69 * fVar78 + fVar74 * fVar97) * fVar89;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar14 * fVar46 + fVar71 * fVar60 + fVar64 * fVar80 + fVar81 * fVar98) * fVar36 +
         (fVar73 * fVar46 + fVar11 * fVar60 + fVar51 * fVar80 + fVar52 * fVar98) * fVar21 +
         (fVar56 * fVar46 + fVar59 * fVar60 + fVar65 * fVar80 + fVar67 * fVar98) * fVar70 +
         (fVar79 * fVar46 + fVar77 * fVar60 + fVar69 * fVar80 + fVar74 * fVar98) * fVar92;
    break;
  case '\x03':
    fVar95 = patch->patch_v[0][0].field_0.m128[3];
    fVar96 = patch->patch_v[0][1].field_0.m128[3];
    fVar97 = patch->patch_v[0][2].field_0.m128[3];
    fVar98 = (uu->field_0).v[0];
    fVar50 = (uu->field_0).v[1];
    fVar86 = (uu->field_0).v[2];
    fVar89 = (uu->field_0).v[3];
    fVar100 = 1.0 - fVar98;
    fVar103 = 1.0 - fVar50;
    fVar106 = 1.0 - fVar86;
    fVar109 = 1.0 - fVar89;
    fVar92 = (vv->field_0).v[0];
    fVar14 = (vv->field_0).v[1];
    fVar71 = (vv->field_0).v[2];
    fVar64 = (vv->field_0).v[3];
    uVar125 = -(uint)((fVar92 != 0.0 && fVar92 != 1.0) && (fVar98 != 1.0 && fVar98 != 0.0));
    uVar127 = -(uint)((fVar14 != 0.0 && fVar14 != 1.0) && (fVar50 != 1.0 && fVar50 != 0.0));
    uVar129 = -(uint)((fVar71 != 0.0 && fVar71 != 1.0) && (fVar86 != 1.0 && fVar86 != 0.0));
    uVar131 = -(uint)((fVar64 != 0.0 && fVar64 != 1.0) && (fVar89 != 1.0 && fVar89 != 0.0));
    fVar81 = patch->patch_v[1][1].field_0.m128[0];
    fVar73 = patch->patch_v[1][1].field_0.m128[1];
    auVar12._4_4_ = fVar73;
    auVar12._0_4_ = fVar73;
    auVar12._8_4_ = fVar73;
    auVar12._12_4_ = fVar73;
    fVar11 = patch->patch_v[1][1].field_0.m128[2];
    auVar13._4_4_ = fVar50 + fVar14;
    auVar13._0_4_ = fVar98 + fVar92;
    auVar13._8_4_ = fVar86 + fVar71;
    auVar13._12_4_ = fVar89 + fVar64;
    auVar13 = rcpps(auVar12,auVar13);
    fVar49 = auVar13._0_4_;
    fVar55 = auVar13._4_4_;
    fVar58 = auVar13._8_4_;
    fVar61 = auVar13._12_4_;
    fVar51 = patch->patch_v[1][0].field_0.m128[3];
    fVar49 = (1.0 - (fVar98 + fVar92) * fVar49) * fVar49 + fVar49;
    fVar55 = (1.0 - (fVar50 + fVar14) * fVar55) * fVar55 + fVar55;
    fVar58 = (1.0 - (fVar86 + fVar71) * fVar58) * fVar58 + fVar58;
    fVar61 = (1.0 - (fVar89 + fVar64) * fVar61) * fVar61 + fVar61;
    fVar52 = patch->patch_v[1][1].field_0.m128[3];
    fVar56 = patch->patch_v[1][2].field_0.m128[0];
    fVar59 = patch->patch_v[1][2].field_0.m128[1];
    fVar83 = 1.0 - fVar92;
    fVar87 = 1.0 - fVar14;
    fVar90 = 1.0 - fVar71;
    fVar93 = 1.0 - fVar64;
    fVar65 = patch->patch_v[3][0].field_0.m128[3];
    fVar67 = patch->patch_v[3][1].field_0.m128[3];
    fVar69 = patch->patch_v[3][2].field_0.m128[3];
    fVar74 = patch->patch_v[1][2].field_0.m128[3];
    fVar26 = fVar100 * fVar100 * fVar100;
    fVar30 = fVar103 * fVar103 * fVar103;
    fVar34 = fVar106 * fVar106 * fVar106;
    fVar38 = fVar109 * fVar109 * fVar109;
    fVar10 = fVar98 * fVar98 * fVar98;
    fVar17 = fVar50 * fVar50 * fVar50;
    fVar20 = fVar86 * fVar86 * fVar86;
    fVar23 = fVar89 * fVar89 * fVar89;
    fVar77 = patch->patch_v[2][0].field_0.m128[3];
    fVar79 = patch->patch_v[2][1].field_0.m128[3];
    fVar82 = patch->patch_v[2][2].field_0.m128[3];
    auVar119._0_4_ = fVar100 + fVar83;
    auVar119._4_4_ = fVar103 + fVar87;
    auVar119._8_4_ = fVar106 + fVar90;
    auVar119._12_4_ = fVar109 + fVar93;
    auVar53._0_4_ = fVar98 + fVar83;
    auVar53._4_4_ = fVar50 + fVar87;
    auVar53._8_4_ = fVar86 + fVar90;
    auVar53._12_4_ = fVar89 + fVar93;
    fVar27 = fVar83 * fVar83 * fVar83;
    fVar31 = fVar87 * fVar87 * fVar87;
    fVar35 = fVar90 * fVar90 * fVar90;
    fVar39 = fVar93 * fVar93 * fVar93;
    auVar85._0_4_ = fVar92 * fVar92 * fVar92;
    auVar85._4_4_ = fVar14 * fVar14 * fVar14;
    auVar85._8_4_ = fVar71 * fVar71 * fVar71;
    auVar85._12_4_ = fVar64 * fVar64 * fVar64;
    fVar1 = patch->patch_v[1][2].field_0.m128[2];
    auVar7._4_4_ = fVar103 + fVar14;
    auVar7._0_4_ = fVar100 + fVar92;
    auVar7._8_4_ = fVar106 + fVar71;
    auVar7._12_4_ = fVar109 + fVar64;
    auVar13 = rcpps(auVar85,auVar7);
    fVar121 = auVar13._0_4_;
    fVar122 = auVar13._4_4_;
    fVar123 = auVar13._8_4_;
    fVar124 = auVar13._12_4_;
    fVar121 = (1.0 - (fVar100 + fVar92) * fVar121) * fVar121 + fVar121;
    fVar122 = (1.0 - (fVar103 + fVar14) * fVar122) * fVar122 + fVar122;
    fVar123 = (1.0 - (fVar106 + fVar71) * fVar123) * fVar123 + fVar123;
    fVar124 = (1.0 - (fVar109 + fVar64) * fVar124) * fVar124 + fVar124;
    fVar2 = patch->patch_v[2][2].field_0.m128[0];
    fVar3 = patch->patch_v[2][2].field_0.m128[1];
    fVar4 = patch->patch_v[2][2].field_0.m128[2];
    auVar75._4_4_ = fVar4;
    auVar75._0_4_ = fVar4;
    auVar75._8_4_ = fVar4;
    auVar75._12_4_ = fVar4;
    auVar13 = rcpps(auVar75,auVar119);
    fVar111 = auVar13._0_4_;
    auVar120._0_4_ = auVar119._0_4_ * fVar111;
    fVar113 = auVar13._4_4_;
    auVar120._4_4_ = auVar119._4_4_ * fVar113;
    fVar115 = auVar13._8_4_;
    auVar120._8_4_ = auVar119._8_4_ * fVar115;
    fVar117 = auVar13._12_4_;
    auVar120._12_4_ = auVar119._12_4_ * fVar117;
    fVar111 = (1.0 - auVar120._0_4_) * fVar111 + fVar111;
    fVar113 = (1.0 - auVar120._4_4_) * fVar113 + fVar113;
    fVar115 = (1.0 - auVar120._8_4_) * fVar115 + fVar115;
    fVar117 = (1.0 - auVar120._12_4_) * fVar117 + fVar117;
    fVar5 = patch->patch_v[2][1].field_0.m128[0];
    fVar6 = patch->patch_v[2][1].field_0.m128[1];
    fVar9 = patch->patch_v[2][1].field_0.m128[2];
    auVar13 = rcpps(auVar120,auVar53);
    fVar84 = auVar13._0_4_;
    fVar88 = auVar13._4_4_;
    fVar91 = auVar13._8_4_;
    fVar94 = auVar13._12_4_;
    fVar84 = (1.0 - auVar53._0_4_ * fVar84) * fVar84 + fVar84;
    fVar88 = (1.0 - auVar53._4_4_ * fVar88) * fVar88 + fVar88;
    fVar91 = (1.0 - auVar53._8_4_ * fVar91) * fVar91 + fVar91;
    fVar94 = (1.0 - auVar53._12_4_ * fVar94) * fVar94 + fVar94;
    fVar126 = fVar100 * fVar98 * fVar100 * 3.0;
    fVar128 = fVar103 * fVar50 * fVar103 * 3.0;
    fVar130 = fVar106 * fVar86 * fVar106 * 3.0;
    fVar132 = fVar109 * fVar89 * fVar109 * 3.0;
    fVar101 = fVar83 * fVar92 * fVar83 * 3.0;
    fVar104 = fVar87 * fVar14 * fVar87 * 3.0;
    fVar107 = fVar90 * fVar71 * fVar90 * 3.0;
    fVar110 = fVar93 * fVar64 * fVar93 * 3.0;
    fVar112 = fVar98 * fVar100 * fVar98 * 3.0;
    fVar114 = fVar50 * fVar103 * fVar50 * 3.0;
    fVar116 = fVar86 * fVar106 * fVar86 * 3.0;
    fVar118 = fVar89 * fVar109 * fVar89 * 3.0;
    fVar41 = fVar92 * fVar83 * fVar92 * 3.0;
    fVar43 = fVar14 * fVar87 * fVar14 * 3.0;
    fVar45 = fVar71 * fVar90 * fVar71 * 3.0;
    fVar47 = fVar64 * fVar93 * fVar64 * 3.0;
    fVar16 = patch->patch_v[0][2].field_0.m128[0];
    fVar19 = patch->patch_v[0][3].field_0.m128[0];
    fVar22 = patch->patch_v[0][1].field_0.m128[0];
    fVar25 = patch->patch_v[0][0].field_0.m128[0];
    fVar29 = patch->patch_v[1][3].field_0.m128[0];
    fVar33 = patch->patch_v[1][0].field_0.m128[0];
    fVar37 = patch->patch_v[2][3].field_0.m128[0];
    fVar8 = patch->patch_v[2][0].field_0.m128[0];
    fVar15 = patch->patch_v[3][2].field_0.m128[0];
    fVar18 = patch->patch_v[3][3].field_0.m128[0];
    fVar21 = patch->patch_v[3][3].field_0.m128[1];
    fVar24 = patch->patch_v[3][1].field_0.m128[0];
    fVar28 = patch->patch_v[3][0].field_0.m128[0];
    fVar32 = patch->patch_v[0][2].field_0.m128[1];
    fVar36 = patch->patch_v[0][3].field_0.m128[1];
    fVar40 = patch->patch_v[0][1].field_0.m128[1];
    fVar42 = patch->patch_v[0][0].field_0.m128[1];
    fVar44 = patch->patch_v[1][3].field_0.m128[1];
    fVar46 = patch->patch_v[1][0].field_0.m128[1];
    fVar48 = patch->patch_v[2][3].field_0.m128[1];
    fVar54 = patch->patch_v[2][0].field_0.m128[1];
    fVar57 = patch->patch_v[3][2].field_0.m128[1];
    fVar60 = patch->patch_v[3][1].field_0.m128[1];
    fVar63 = patch->patch_v[3][0].field_0.m128[1];
    fVar66 = patch->patch_v[0][2].field_0.m128[2];
    fVar68 = patch->patch_v[0][3].field_0.m128[2];
    fVar70 = patch->patch_v[0][1].field_0.m128[2];
    fVar72 = patch->patch_v[0][0].field_0.m128[2];
    fVar76 = patch->patch_v[1][3].field_0.m128[2];
    fVar78 = patch->patch_v[1][0].field_0.m128[2];
    fVar80 = patch->patch_v[2][3].field_0.m128[2];
    fVar99 = patch->patch_v[2][0].field_0.m128[2];
    fVar62 = patch->patch_v[3][3].field_0.m128[2];
    fVar102 = patch->patch_v[3][2].field_0.m128[2];
    fVar105 = patch->patch_v[3][1].field_0.m128[2];
    fVar108 = patch->patch_v[3][0].field_0.m128[2];
    *(float *)&in_RDI->field_0 =
         (fVar25 * fVar26 + fVar22 * fVar126 + fVar16 * fVar112 + fVar19 * fVar10) * fVar27 +
         (fVar33 * fVar26 +
         (float)(~uVar125 & (uint)fVar81 |
                (uint)((fVar95 * fVar92 + fVar98 * fVar81) * fVar49) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar56 |
                (uint)((fVar92 * fVar56 + fVar51 * fVar100) * fVar121) & uVar125) * fVar112 +
         fVar29 * fVar10) * fVar101 +
         (fVar8 * fVar26 +
         (float)(~uVar125 & (uint)fVar5 |
                (uint)((fVar83 * fVar5 + fVar65 * fVar98) * fVar84) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar2 |
                (uint)((fVar77 * fVar83 + fVar100 * fVar2) * fVar111) & uVar125) * fVar112 +
         fVar37 * fVar10) * fVar41 +
         (fVar28 * fVar26 + fVar24 * fVar126 + fVar15 * fVar112 + fVar18 * fVar10) * auVar85._0_4_;
    *(float *)((long)&in_RDI->field_0 + 4) =
         (fVar25 * fVar30 + fVar22 * fVar128 + fVar16 * fVar114 + fVar19 * fVar17) * fVar31 +
         (fVar33 * fVar30 +
         (float)(~uVar127 & (uint)fVar81 |
                (uint)((fVar95 * fVar14 + fVar50 * fVar81) * fVar55) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar56 |
                (uint)((fVar14 * fVar56 + fVar51 * fVar103) * fVar122) & uVar127) * fVar114 +
         fVar29 * fVar17) * fVar104 +
         (fVar8 * fVar30 +
         (float)(~uVar127 & (uint)fVar5 |
                (uint)((fVar87 * fVar5 + fVar65 * fVar50) * fVar88) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar2 |
                (uint)((fVar77 * fVar87 + fVar103 * fVar2) * fVar113) & uVar127) * fVar114 +
         fVar37 * fVar17) * fVar43 +
         (fVar28 * fVar30 + fVar24 * fVar128 + fVar15 * fVar114 + fVar18 * fVar17) * auVar85._4_4_;
    *(float *)((long)&in_RDI->field_0 + 8) =
         (fVar25 * fVar34 + fVar22 * fVar130 + fVar16 * fVar116 + fVar19 * fVar20) * fVar35 +
         (fVar33 * fVar34 +
         (float)(~uVar129 & (uint)fVar81 |
                (uint)((fVar95 * fVar71 + fVar86 * fVar81) * fVar58) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar56 |
                (uint)((fVar71 * fVar56 + fVar51 * fVar106) * fVar123) & uVar129) * fVar116 +
         fVar29 * fVar20) * fVar107 +
         (fVar8 * fVar34 +
         (float)(~uVar129 & (uint)fVar5 |
                (uint)((fVar90 * fVar5 + fVar65 * fVar86) * fVar91) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar2 |
                (uint)((fVar77 * fVar90 + fVar106 * fVar2) * fVar115) & uVar129) * fVar116 +
         fVar37 * fVar20) * fVar45 +
         (fVar28 * fVar34 + fVar24 * fVar130 + fVar15 * fVar116 + fVar18 * fVar20) * auVar85._8_4_;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         (fVar25 * fVar38 + fVar22 * fVar132 + fVar16 * fVar118 + fVar19 * fVar23) * fVar39 +
         (fVar33 * fVar38 +
         (float)(~uVar131 & (uint)fVar81 |
                (uint)((fVar95 * fVar64 + fVar89 * fVar81) * fVar61) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar56 |
                (uint)((fVar64 * fVar56 + fVar51 * fVar109) * fVar124) & uVar131) * fVar118 +
         fVar29 * fVar23) * fVar110 +
         (fVar8 * fVar38 +
         (float)(~uVar131 & (uint)fVar5 |
                (uint)((fVar93 * fVar5 + fVar65 * fVar89) * fVar94) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar2 |
                (uint)((fVar77 * fVar93 + fVar109 * fVar2) * fVar117) & uVar131) * fVar118 +
         fVar37 * fVar23) * fVar47 +
         (fVar28 * fVar38 + fVar24 * fVar132 + fVar15 * fVar118 + fVar18 * fVar23) * auVar85._12_4_;
    *(float *)((long)&in_RDI->field_0 + 0x10) =
         (fVar42 * fVar26 + fVar40 * fVar126 + fVar32 * fVar112 + fVar36 * fVar10) * fVar27 +
         (fVar46 * fVar26 +
         (float)(~uVar125 & (uint)fVar73 |
                (uint)((fVar96 * fVar92 + fVar98 * fVar73) * fVar49) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar59 |
                (uint)((fVar92 * fVar59 + fVar52 * fVar100) * fVar121) & uVar125) * fVar112 +
         fVar44 * fVar10) * fVar101 +
         (fVar54 * fVar26 +
         (float)(~uVar125 & (uint)fVar6 |
                (uint)((fVar83 * fVar6 + fVar67 * fVar98) * fVar84) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar3 |
                (uint)((fVar79 * fVar83 + fVar100 * fVar3) * fVar111) & uVar125) * fVar112 +
         fVar48 * fVar10) * fVar41 +
         (fVar63 * fVar26 + fVar60 * fVar126 + fVar57 * fVar112 + fVar21 * fVar10) * auVar85._0_4_;
    *(float *)((long)&in_RDI->field_0 + 0x14) =
         (fVar42 * fVar30 + fVar40 * fVar128 + fVar32 * fVar114 + fVar36 * fVar17) * fVar31 +
         (fVar46 * fVar30 +
         (float)(~uVar127 & (uint)fVar73 |
                (uint)((fVar96 * fVar14 + fVar50 * fVar73) * fVar55) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar59 |
                (uint)((fVar14 * fVar59 + fVar52 * fVar103) * fVar122) & uVar127) * fVar114 +
         fVar44 * fVar17) * fVar104 +
         (fVar54 * fVar30 +
         (float)(~uVar127 & (uint)fVar6 |
                (uint)((fVar87 * fVar6 + fVar67 * fVar50) * fVar88) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar3 |
                (uint)((fVar79 * fVar87 + fVar103 * fVar3) * fVar113) & uVar127) * fVar114 +
         fVar48 * fVar17) * fVar43 +
         (fVar63 * fVar30 + fVar60 * fVar128 + fVar57 * fVar114 + fVar21 * fVar17) * auVar85._4_4_;
    *(float *)((long)&in_RDI->field_0 + 0x18) =
         (fVar42 * fVar34 + fVar40 * fVar130 + fVar32 * fVar116 + fVar36 * fVar20) * fVar35 +
         (fVar46 * fVar34 +
         (float)(~uVar129 & (uint)fVar73 |
                (uint)((fVar96 * fVar71 + fVar86 * fVar73) * fVar58) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar59 |
                (uint)((fVar71 * fVar59 + fVar52 * fVar106) * fVar123) & uVar129) * fVar116 +
         fVar44 * fVar20) * fVar107 +
         (fVar54 * fVar34 +
         (float)(~uVar129 & (uint)fVar6 |
                (uint)((fVar90 * fVar6 + fVar67 * fVar86) * fVar91) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar3 |
                (uint)((fVar79 * fVar90 + fVar106 * fVar3) * fVar115) & uVar129) * fVar116 +
         fVar48 * fVar20) * fVar45 +
         (fVar63 * fVar34 + fVar60 * fVar130 + fVar57 * fVar116 + fVar21 * fVar20) * auVar85._8_4_;
    *(float *)((long)&in_RDI->field_0 + 0x1c) =
         (fVar42 * fVar38 + fVar40 * fVar132 + fVar32 * fVar118 + fVar36 * fVar23) * fVar39 +
         (fVar46 * fVar38 +
         (float)(~uVar131 & (uint)fVar73 |
                (uint)((fVar96 * fVar64 + fVar89 * fVar73) * fVar61) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar59 |
                (uint)((fVar64 * fVar59 + fVar52 * fVar109) * fVar124) & uVar131) * fVar118 +
         fVar44 * fVar23) * fVar110 +
         (fVar54 * fVar38 +
         (float)(~uVar131 & (uint)fVar6 |
                (uint)((fVar93 * fVar6 + fVar67 * fVar89) * fVar94) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar3 |
                (uint)((fVar79 * fVar93 + fVar109 * fVar3) * fVar117) & uVar131) * fVar118 +
         fVar48 * fVar23) * fVar47 +
         (fVar63 * fVar38 + fVar60 * fVar132 + fVar57 * fVar118 + fVar21 * fVar23) * auVar85._12_4_;
    *(float *)((long)&in_RDI->field_0 + 0x20) =
         (fVar72 * fVar26 + fVar70 * fVar126 + fVar66 * fVar112 + fVar68 * fVar10) * fVar27 +
         (fVar78 * fVar26 +
         (float)(~uVar125 & (uint)fVar11 |
                (uint)(fVar49 * (fVar97 * fVar92 + fVar98 * fVar11)) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar1 |
                (uint)(fVar121 * (fVar92 * fVar1 + fVar74 * fVar100)) & uVar125) * fVar112 +
         fVar76 * fVar10) * fVar101 +
         (fVar99 * fVar26 +
         (float)(~uVar125 & (uint)fVar9 |
                (uint)(fVar84 * (fVar83 * fVar9 + fVar69 * fVar98)) & uVar125) * fVar126 +
         (float)(~uVar125 & (uint)fVar4 |
                (uint)(fVar111 * (fVar82 * fVar83 + fVar100 * fVar4)) & uVar125) * fVar112 +
         fVar80 * fVar10) * fVar41 +
         (fVar108 * fVar26 + fVar105 * fVar126 + fVar102 * fVar112 + fVar62 * fVar10) *
         auVar85._0_4_;
    *(float *)((long)&in_RDI->field_0 + 0x24) =
         (fVar72 * fVar30 + fVar70 * fVar128 + fVar66 * fVar114 + fVar68 * fVar17) * fVar31 +
         (fVar78 * fVar30 +
         (float)(~uVar127 & (uint)fVar11 |
                (uint)(fVar55 * (fVar97 * fVar14 + fVar50 * fVar11)) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar1 |
                (uint)(fVar122 * (fVar14 * fVar1 + fVar74 * fVar103)) & uVar127) * fVar114 +
         fVar76 * fVar17) * fVar104 +
         (fVar99 * fVar30 +
         (float)(~uVar127 & (uint)fVar9 |
                (uint)(fVar88 * (fVar87 * fVar9 + fVar69 * fVar50)) & uVar127) * fVar128 +
         (float)(~uVar127 & (uint)fVar4 |
                (uint)(fVar113 * (fVar82 * fVar87 + fVar103 * fVar4)) & uVar127) * fVar114 +
         fVar80 * fVar17) * fVar43 +
         (fVar108 * fVar30 + fVar105 * fVar128 + fVar102 * fVar114 + fVar62 * fVar17) *
         auVar85._4_4_;
    *(float *)((long)&in_RDI->field_0 + 0x28) =
         (fVar72 * fVar34 + fVar70 * fVar130 + fVar66 * fVar116 + fVar68 * fVar20) * fVar35 +
         (fVar78 * fVar34 +
         (float)(~uVar129 & (uint)fVar11 |
                (uint)(fVar58 * (fVar97 * fVar71 + fVar86 * fVar11)) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar1 |
                (uint)(fVar123 * (fVar71 * fVar1 + fVar74 * fVar106)) & uVar129) * fVar116 +
         fVar76 * fVar20) * fVar107 +
         (fVar99 * fVar34 +
         (float)(~uVar129 & (uint)fVar9 |
                (uint)(fVar91 * (fVar90 * fVar9 + fVar69 * fVar86)) & uVar129) * fVar130 +
         (float)(~uVar129 & (uint)fVar4 |
                (uint)(fVar115 * (fVar82 * fVar90 + fVar106 * fVar4)) & uVar129) * fVar116 +
         fVar80 * fVar20) * fVar45 +
         (fVar108 * fVar34 + fVar105 * fVar130 + fVar102 * fVar116 + fVar62 * fVar20) *
         auVar85._8_4_;
    *(float *)((long)&in_RDI->field_0 + 0x2c) =
         (fVar72 * fVar38 + fVar70 * fVar132 + fVar66 * fVar118 + fVar68 * fVar23) * fVar39 +
         (fVar78 * fVar38 +
         (float)(~uVar131 & (uint)fVar11 |
                (uint)(fVar61 * (fVar97 * fVar64 + fVar89 * fVar11)) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar1 |
                (uint)(fVar124 * (fVar64 * fVar1 + fVar74 * fVar109)) & uVar131) * fVar118 +
         fVar76 * fVar23) * fVar110 +
         (fVar99 * fVar38 +
         (float)(~uVar131 & (uint)fVar9 |
                (uint)(fVar94 * (fVar93 * fVar9 + fVar69 * fVar89)) & uVar131) * fVar132 +
         (float)(~uVar131 & (uint)fVar4 |
                (uint)(fVar117 * (fVar82 * fVar93 + fVar109 * fVar4)) & uVar131) * fVar118 +
         fVar80 * fVar23) * fVar47 +
         (fVar108 * fVar38 + fVar105 * fVar132 + fVar102 * fVar118 + fVar62 * fVar23) *
         auVar85._12_4_;
    return in_RDI;
  default:
    *(undefined8 *)((long)&in_RDI->field_0 + 0x20) = 0;
    *(undefined8 *)((long)&in_RDI->field_0 + 0x28) = 0;
    *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = 0;
    *(undefined8 *)((long)&in_RDI->field_0 + 0x18) = 0;
    *(undefined8 *)&in_RDI->field_0 = 0;
    *(undefined8 *)((long)&in_RDI->field_0 + 8) = 0;
    return in_RDI;
  case '\x06':
    fVar62 = patch->patch_v[0][0].field_0.m128[0];
    fVar50 = patch->patch_v[0][1].field_0.m128[0] - fVar62;
    fVar95 = (uu->field_0).v[0];
    fVar96 = (uu->field_0).v[1];
    fVar97 = (uu->field_0).v[2];
    fVar98 = (uu->field_0).v[3];
    fVar51 = fVar50 * fVar95 + fVar62;
    fVar56 = fVar50 * fVar96 + fVar62;
    fVar59 = fVar50 * fVar97 + fVar62;
    fVar62 = fVar50 * fVar98 + fVar62;
    fVar50 = patch->patch_v[0][3].field_0.m128[0];
    fVar11 = patch->patch_v[0][2].field_0.m128[0] - fVar50;
    fVar86 = (vv->field_0).v[0];
    fVar89 = (vv->field_0).v[1];
    fVar92 = (vv->field_0).v[2];
    fVar14 = (vv->field_0).v[3];
    fVar71 = patch->patch_v[0][0].field_0.m128[1];
    fVar64 = patch->patch_v[0][1].field_0.m128[1] - fVar71;
    fVar65 = fVar64 * fVar95 + fVar71;
    fVar67 = fVar64 * fVar96 + fVar71;
    fVar69 = fVar64 * fVar97 + fVar71;
    fVar71 = fVar64 * fVar98 + fVar71;
    fVar64 = patch->patch_v[0][3].field_0.m128[1];
    fVar52 = patch->patch_v[0][2].field_0.m128[1] - fVar64;
    fVar81 = patch->patch_v[0][0].field_0.m128[2];
    fVar73 = patch->patch_v[0][1].field_0.m128[2] - fVar81;
    fVar74 = fVar73 * fVar95 + fVar81;
    fVar77 = fVar73 * fVar96 + fVar81;
    fVar79 = fVar73 * fVar97 + fVar81;
    fVar81 = fVar73 * fVar98 + fVar81;
    fVar73 = patch->patch_v[0][3].field_0.m128[2];
    fVar82 = patch->patch_v[0][2].field_0.m128[2] - fVar73;
    *(float *)&in_RDI->field_0 = ((fVar11 * fVar95 + fVar50) - fVar51) * fVar86 + fVar51;
    *(float *)((long)&in_RDI->field_0 + 4) = ((fVar11 * fVar96 + fVar50) - fVar56) * fVar89 + fVar56
    ;
    *(float *)((long)&in_RDI->field_0 + 8) = ((fVar11 * fVar97 + fVar50) - fVar59) * fVar92 + fVar59
    ;
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         ((fVar11 * fVar98 + fVar50) - fVar62) * fVar14 + fVar62;
    *(float *)((long)&in_RDI->field_0 + 0x10) =
         ((fVar52 * fVar95 + fVar64) - fVar65) * fVar86 + fVar65;
    *(float *)((long)&in_RDI->field_0 + 0x14) =
         ((fVar52 * fVar96 + fVar64) - fVar67) * fVar89 + fVar67;
    *(float *)((long)&in_RDI->field_0 + 0x18) =
         ((fVar52 * fVar97 + fVar64) - fVar69) * fVar92 + fVar69;
    *(float *)((long)&in_RDI->field_0 + 0x1c) =
         ((fVar52 * fVar98 + fVar64) - fVar71) * fVar14 + fVar71;
    *(float *)((long)&in_RDI->field_0 + 0x20) =
         ((fVar82 * fVar95 + fVar73) - fVar74) * fVar86 + fVar74;
    *(float *)((long)&in_RDI->field_0 + 0x24) =
         ((fVar82 * fVar96 + fVar73) - fVar77) * fVar89 + fVar77;
    *(float *)((long)&in_RDI->field_0 + 0x28) =
         ((fVar82 * fVar97 + fVar73) - fVar79) * fVar92 + fVar79;
    *(float *)((long)&in_RDI->field_0 + 0x2c) =
         ((fVar82 * fVar98 + fVar73) - fVar81) * fVar14 + fVar81;
    return in_RDI;
  }
  *(float *)((long)&in_RDI->field_0 + 0x10) = fVar99;
  *(float *)((long)&in_RDI->field_0 + 0x14) = fVar102;
  *(float *)((long)&in_RDI->field_0 + 0x18) = fVar105;
  *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar108;
  *(float *)((long)&in_RDI->field_0 + 0x20) = fVar49;
  *(float *)((long)&in_RDI->field_0 + 0x24) = fVar10;
  *(float *)((long)&in_RDI->field_0 + 0x28) = fVar55;
  *(float *)((long)&in_RDI->field_0 + 0x2c) = fVar62;
  return in_RDI;
}

Assistant:

Vec3<simdf> patchEval(const SubdivPatch1Base& patch, const simdf& uu, const simdf& vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3<simdf>( zero );
    }